

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

shared_ptr<SchemeFilePort> SchemeFilePort::create_default_port(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  basic_istream<char,_std::char_traits<char>_> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<SchemeFilePort> sVar5;
  
  puVar2 = (undefined8 *)operator_new(0x40);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_0017ae08;
  *(undefined4 *)(puVar2 + 3) = 2;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[2] = &PTR__SchemeFilePort_0017a598;
  *(undefined8 **)&(in_RDI->super_SchemePort).type = puVar2;
  (in_RDI->super_SchemePort).super_SchemeObject._vptr_SchemeObject = (_func_int **)(puVar2 + 2);
  puVar3 = (undefined8 *)operator_new(0x18);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_base_0017ac58;
  puVar3[2] = &std::cin;
  puVar2[4] = &std::cin;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[5];
  puVar2[5] = puVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  puVar3 = (undefined8 *)operator_new(0x18);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_base_0017aca8;
  puVar3[2] = &std::cout;
  puVar2[6] = &std::cout;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[7];
  puVar2[7] = puVar3;
  _Var4._M_pi = extraout_RDX;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<SchemeFilePort>)
         sVar5.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeFilePort> SchemeFilePort::create_default_port()
{
    auto p = std::make_shared<SchemeFilePort>(port_type_t::IO);
    p->input_stream = std::shared_ptr<std::istream>(&std::cin, [](void*){});
    p->output_stream = std::shared_ptr<std::ostream>(&std::cout, [](void*){});
    return p;
}